

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

int nng_stat_type(nng_stat *stat)

{
  return stat->s_info->si_type;
}

Assistant:

int
nng_stat_type(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	return (stat->s_info->si_type);
#else
	NNI_ARG_UNUSED(stat);
	return (NNG_STAT_ID);
#endif
}